

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

Aig_Man_t * Aig_ManPartSplitOne(Aig_Man_t *p,Vec_Ptr_t *vNodes,Vec_Int_t **pvPio2Id)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *pNew_00;
  Vec_Int_t *vPio2Id_00;
  int local_3c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Int_t *vPio2Id;
  Vec_Int_t **pvPio2Id_local;
  Vec_Ptr_t *vNodes_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  for (local_3c = 0; iVar1 = Vec_PtrSize(vNodes), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_3c);
    Aig_ObjSetTravIdCurrent(p,pAVar3);
    (pAVar3->field_5).pData = (void *)0x0;
  }
  iVar1 = Vec_PtrSize(vNodes);
  pNew_00 = Aig_ManStart(iVar1);
  vPio2Id_00 = Vec_IntAlloc(100);
  for (local_3c = 0; iVar1 = Vec_PtrSize(vNodes), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_3c);
    Aig_ManPartSplitOne_rec(pNew_00,p,pAVar3,vPio2Id_00);
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(vNodes), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_3c);
    iVar1 = Aig_ObjRefs((Aig_Obj_t *)(pAVar3->field_5).pData);
    iVar2 = Aig_ObjRefs(pAVar3);
    if (iVar1 != iVar2) {
      iVar1 = Aig_ObjRefs((Aig_Obj_t *)(pAVar3->field_5).pData);
      iVar2 = Aig_ObjRefs(pAVar3);
      if (iVar2 <= iVar1) {
        __assert_fail("Aig_ObjRefs((Aig_Obj_t *)pObj->pData) < Aig_ObjRefs(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPartSat.c"
                      ,199,"Aig_Man_t *Aig_ManPartSplitOne(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t **)")
        ;
      }
      Aig_ObjCreateCo(pNew_00,(Aig_Obj_t *)(pAVar3->field_5).pData);
      iVar1 = Aig_ObjId(pAVar3);
      Vec_IntPush(vPio2Id_00,iVar1);
    }
  }
  iVar1 = Aig_ManNodeNum(pNew_00);
  iVar2 = Vec_PtrSize(vNodes);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManNodeNum(pNew) == Vec_PtrSize(vNodes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigPartSat.c"
                  ,0xcb,"Aig_Man_t *Aig_ManPartSplitOne(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t **)");
  }
  *pvPio2Id = vPio2Id_00;
  return pNew_00;
}

Assistant:

Aig_Man_t * Aig_ManPartSplitOne( Aig_Man_t * p, Vec_Ptr_t * vNodes, Vec_Int_t ** pvPio2Id )
{
    Vec_Int_t * vPio2Id;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // mark these nodes
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        Aig_ObjSetTravIdCurrent( p, pObj );
        pObj->pData = NULL;
    }
    // add these nodes in a DFS order
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    vPio2Id = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManPartSplitOne_rec( pNew, p, pObj, vPio2Id );
    // add the POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjRefs((Aig_Obj_t *)pObj->pData) != Aig_ObjRefs(pObj) )
        {
            assert( Aig_ObjRefs((Aig_Obj_t *)pObj->pData) < Aig_ObjRefs(pObj) );
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
            Vec_IntPush( vPio2Id, Aig_ObjId(pObj) );
        }
    assert( Aig_ManNodeNum(pNew) == Vec_PtrSize(vNodes) );
    *pvPio2Id = vPio2Id;
    return pNew;
}